

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_data.cpp
# Opt level: O2

FFlagDef * FindFlag(PClass *type,char *part1,char *part2,bool strict)

{
  PClass *this;
  NameEntry *pNVar1;
  bool bVar2;
  int iVar3;
  FFlagDef *pFVar4;
  long lVar5;
  long lVar6;
  
  pNVar1 = FName::NameData.NameArray;
  if (part2 == (char *)0x0) {
    lVar6 = 0xa8;
    if (strict) {
      lVar6 = 0x30;
    }
    lVar5 = 0;
    while ((pFVar4 = (FFlagDef *)0x0, lVar6 != lVar5 &&
           ((((*(byte *)((long)&FlagLists[0].Use + lVar5) & 1) == 0 ||
             (bVar2 = PClass::IsAncestorOf
                                ((PClass *)**(undefined8 **)((long)&FlagLists[0].Type + lVar5),type)
             , !bVar2)) ||
            (pFVar4 = FindFlag(*(FFlagDef **)((long)&FlagLists[0].Defs + lVar5),
                               *(int *)((long)&FlagLists[0].NumDefs + lVar5),part1),
            pFVar4 == (FFlagDef *)0x0))))) {
      lVar5 = lVar5 + 0x18;
    }
  }
  else {
    lVar6 = 0;
    do {
      lVar5 = lVar6;
      if (lVar5 + 0x18 == 0xc0) goto LAB_00501c7d;
      this = (PClass *)**(undefined8 **)((long)&FlagLists[0].Type + lVar5);
      iVar3 = strcasecmp(pNVar1[(this->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.
                                Index].Text,part1);
      lVar6 = lVar5 + 0x18;
    } while (iVar3 != 0);
    bVar2 = PClass::IsAncestorOf(this,type);
    if (bVar2) {
      pFVar4 = FindFlag(*(FFlagDef **)((long)&FlagLists[0].Defs + lVar5),
                        *(int *)((long)&FlagLists[0].NumDefs + lVar5),part2);
      return pFVar4;
    }
LAB_00501c7d:
    pFVar4 = (FFlagDef *)0x0;
  }
  return pFVar4;
}

Assistant:

FFlagDef *FindFlag (const PClass *type, const char *part1, const char *part2, bool strict)
{
	FFlagDef *def;

	if (part2 == NULL)
	{ // Search all lists
		int max = strict ? 2 : NUM_FLAG_LISTS;
		for (int i = 0; i < max; ++i)
		{
			if ((FlagLists[i].Use & 1) && type->IsDescendantOf (*FlagLists[i].Type))
			{
				def = FindFlag (FlagLists[i].Defs, FlagLists[i].NumDefs, part1);
				if (def != NULL)
				{
					return def;
				}
			}
		}
	}
	else
	{ // Search just the named list
		for (size_t i = 0; i < NUM_FLAG_LISTS; ++i)
		{
			if (stricmp ((*FlagLists[i].Type)->TypeName.GetChars(), part1) == 0)
			{
				if (type->IsDescendantOf (*FlagLists[i].Type))
				{
					return FindFlag (FlagLists[i].Defs, FlagLists[i].NumDefs, part2);
				}
				else
				{
					return NULL;
				}
			}
		}
	}
	return NULL;
}